

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_sense(envy_bios *bios)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint offs;
  envy_bios_power_sense *peVar5;
  envy_bios_power_sense_entry *peVar6;
  int local_34;
  int local_30;
  int j_1;
  int j;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_sense *sense;
  envy_bios *bios_local;
  
  peVar5 = &(bios->power).sense;
  if (peVar5->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar5->offset,&(bios->power).sense.version);
    uVar1 = (bios->power).sense.version;
    if ((uVar1 == '\x10') || (uVar1 == ' ')) {
      iVar2 = bios_u8(bios,peVar5->offset + 1,&(bios->power).sense.hlen);
      iVar3 = bios_u8(bios,peVar5->offset + 2,&(bios->power).sense.rlen);
      iVar4 = bios_u8(bios,peVar5->offset + 3,&(bios->power).sense.entriesnum);
      (bios->power).sense.valid = ((iVar4 != 0 || (iVar3 != 0 || iVar2 != 0)) ^ 0xffU) & 1;
      peVar6 = (envy_bios_power_sense_entry *)malloc((ulong)(bios->power).sense.entriesnum * 0x18);
      (bios->power).sense.entries = peVar6;
      for (data = 0; (int)data < (int)(uint)(bios->power).sense.entriesnum; data = data + 1) {
        offs = peVar5->offset + (uint)(bios->power).sense.hlen + data * (bios->power).sense.rlen;
        (bios->power).sense.entries[(int)data].offset = offs;
        uVar1 = (bios->power).sense.version;
        if (uVar1 == '\x10') {
          bios_u8(bios,offs + 1,&(bios->power).sense.entries[(int)data].mode);
          bios_u8(bios,offs + 2,&(bios->power).sense.entries[(int)data].extdev_id);
          if (0x10 < (int)((bios->power).sense.rlen - 3)) {
            fprintf(_stderr,"SENSE table entry bigger than expected\n");
          }
          for (local_30 = 0; local_30 < (int)((bios->power).sense.rlen - 3) && local_30 < 0x10;
              local_30 = local_30 + 1) {
            bios_u8(bios,offs + 3 + local_30,(bios->power).sense.entries[(int)data].d.raw + local_30
                   );
          }
        }
        else if (uVar1 == ' ') {
          bios_u8(bios,offs,&(bios->power).sense.entries[(int)data].mode);
          bios_u8(bios,offs + 1,&(bios->power).sense.entries[(int)data].extdev_id);
          if (0x10 < (int)((bios->power).sense.rlen - 5)) {
            fprintf(_stderr,"SENSE table entry bigger than expected\n");
          }
          for (local_34 = 0; local_34 < (int)((bios->power).sense.rlen - 5) && local_34 < 0x10;
              local_34 = local_34 + 1) {
            bios_u8(bios,offs + 5 + local_34,(bios->power).sense.entries[(int)data].d.raw + local_34
                   );
          }
        }
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown SENSE table version 0x%x\n",(ulong)(bios->power).sense.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_sense(struct envy_bios *bios) {
	struct envy_bios_power_sense *sense = &bios->power.sense;
	int i, err = 0;

	if (!sense->offset)
		return -EINVAL;

	bios_u8(bios, sense->offset + 0x0, &sense->version);
	switch(sense->version) {
	case 0x10:
	case 0x20:
		err |= bios_u8(bios, sense->offset + 0x1, &sense->hlen);
		err |= bios_u8(bios, sense->offset + 0x2, &sense->rlen);
		err |= bios_u8(bios, sense->offset + 0x3, &sense->entriesnum);
		sense->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown SENSE table version 0x%x\n", sense->version);
		return -EINVAL;
	};

	err = 0;
	sense->entries = malloc(sense->entriesnum * sizeof(struct envy_bios_power_sense_entry));
	for (i = 0; i < sense->entriesnum; i++) {
		uint32_t data = sense->offset + sense->hlen + i * sense->rlen;

		sense->entries[i].offset = data;

		switch(sense->version) {
		case 0x10:
			err |= bios_u8(bios, data + 0x1, &sense->entries[i].mode);
			err |= bios_u8(bios, data + 0x2, &sense->entries[i].extdev_id);
			if (sense->rlen - 0x3 > 0x10)
				ENVY_BIOS_ERR("SENSE table entry bigger than expected\n");
			for (int j = 0; j < sense->rlen - 0x3 && j < 0x10; ++j)
				err |= bios_u8(bios, data + 0x3 + j, &sense->entries[i].d.raw[j]);
			break;
		case 0x20:
			err |= bios_u8(bios, data + 0x0, &sense->entries[i].mode);
			err |= bios_u8(bios, data + 0x1, &sense->entries[i].extdev_id);
			if (sense->rlen - 0x5 > 0x10)
				ENVY_BIOS_ERR("SENSE table entry bigger than expected\n");
			for (int j = 0; j < sense->rlen - 0x5 && j < 0x10; ++j)
				err |= bios_u8(bios, data + 0x5 + j, &sense->entries[i].d.raw[j]);
			break;
		};
	}

	return 0;
}